

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Text.cpp
# Opt level: O0

void __thiscall sf::Text::Text(Text *this,String *string,Font *font,uint characterSize)

{
  undefined4 in_ECX;
  _func_int **in_RDX;
  VertexArray *in_RSI;
  Drawable *in_RDI;
  String *in_stack_ffffffffffffffa8;
  Transformable *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffe0;
  PrimitiveType type;
  
  Drawable::Drawable(in_RDI);
  Transformable::Transformable(in_stack_ffffffffffffffb0);
  in_RDI->_vptr_Drawable = (_func_int **)&PTR__Text_002f8650;
  in_RDI[1]._vptr_Drawable = (_func_int **)&PTR__Text_002f8678;
  String::String((String *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  in_RDI[0x1b]._vptr_Drawable = in_RDX;
  *(undefined4 *)&in_RDI[0x1c]._vptr_Drawable = in_ECX;
  *(undefined4 *)((long)&in_RDI[0x1c]._vptr_Drawable + 4) = 0x3f800000;
  *(undefined4 *)&in_RDI[0x1d]._vptr_Drawable = 0x3f800000;
  *(undefined4 *)((long)&in_RDI[0x1d]._vptr_Drawable + 4) = 0;
  Color::Color((Color *)(in_RDI + 0x1e),0xff,0xff,0xff,0xff);
  type = (PrimitiveType)((ulong)in_RDX >> 0x20);
  Color::Color((Color *)((long)&in_RDI[0x1e]._vptr_Drawable + 4),'\0','\0','\0',0xff);
  *(undefined4 *)&in_RDI[0x1f]._vptr_Drawable = 0;
  VertexArray::VertexArray(in_RSI,type,CONCAT44(in_ECX,in_stack_ffffffffffffffe0));
  VertexArray::VertexArray(in_RSI,type,CONCAT44(in_ECX,in_stack_ffffffffffffffe0));
  Rect<float>::Rect((Rect<float> *)(in_RDI + 0x2a));
  *(undefined1 *)&in_RDI[0x2c]._vptr_Drawable = 1;
  in_RDI[0x2d]._vptr_Drawable = (_func_int **)0x0;
  return;
}

Assistant:

Text::Text(const String& string, const Font& font, unsigned int characterSize) :
m_string             (string),
m_font               (&font),
m_characterSize      (characterSize),
m_letterSpacingFactor(1.f),
m_lineSpacingFactor  (1.f),
m_style              (Regular),
m_fillColor          (255, 255, 255),
m_outlineColor       (0, 0, 0),
m_outlineThickness   (0),
m_vertices           (Triangles),
m_outlineVertices    (Triangles),
m_bounds             (),
m_geometryNeedUpdate (true),
m_fontTextureId      (0)
{

}